

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

void glfwSetGammaRamp(GLFWmonitor *handle,GLFWgammaramp *ramp)

{
  GLFWbool GVar1;
  GLFWgammaramp *in_RSI;
  _GLFWmonitor *in_RDI;
  _GLFWmonitor *monitor;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if (in_RSI->size == 0) {
    _glfwInputError(0x10004,"Invalid gamma ramp size %i",(ulong)in_RSI->size);
  }
  else if (((in_RDI->originalRamp).size != 0) ||
          (GVar1 = (*_glfw.platform.getGammaRamp)(in_RDI,&in_RDI->originalRamp), GVar1 != 0)) {
    (*_glfw.platform.setGammaRamp)(in_RDI,in_RSI);
  }
  return;
}

Assistant:

GLFWAPI void glfwSetGammaRamp(GLFWmonitor* handle, const GLFWgammaramp* ramp)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    assert(monitor != NULL);
    assert(ramp != NULL);
    assert(ramp->size > 0);
    assert(ramp->red != NULL);
    assert(ramp->green != NULL);
    assert(ramp->blue != NULL);

    _GLFW_REQUIRE_INIT();

    if (ramp->size <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Invalid gamma ramp size %i",
                        ramp->size);
        return;
    }

    if (!monitor->originalRamp.size)
    {
        if (!_glfw.platform.getGammaRamp(monitor, &monitor->originalRamp))
            return;
    }

    _glfw.platform.setGammaRamp(monitor, ramp);
}